

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O0

bool __thiscall
google::protobuf::compiler::Parser::ConsumeNumber(Parser *this,double *output,char *error)

{
  uint64 __s;
  bool bVar1;
  Token *pTVar2;
  double dVar3;
  undefined1 auVar4 [16];
  allocator<char> local_89;
  string local_88;
  allocator<char> local_51;
  string local_50;
  uint64 local_30;
  uint64 value;
  char *error_local;
  double *output_local;
  Parser *this_local;
  
  value = (uint64)error;
  error_local = (char *)output;
  output_local = (double *)this;
  bVar1 = LookingAtType(this,TYPE_FLOAT);
  if (bVar1) {
    pTVar2 = io::Tokenizer::current(this->input_);
    dVar3 = io::Tokenizer::ParseFloat(&pTVar2->text);
    *(double *)error_local = dVar3;
    io::Tokenizer::Next(this->input_);
    this_local._7_1_ = true;
  }
  else {
    bVar1 = LookingAtType(this,TYPE_INTEGER);
    if (bVar1) {
      local_30 = 0;
      pTVar2 = io::Tokenizer::current(this->input_);
      bVar1 = io::Tokenizer::ParseInteger(&pTVar2->text,0xffffffffffffffff,&local_30);
      if (!bVar1) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_50,"Integer out of range.",&local_51);
        AddError(this,&local_50);
        std::__cxx11::string::~string((string *)&local_50);
        std::allocator<char>::~allocator(&local_51);
      }
      auVar4._8_4_ = (int)(local_30 >> 0x20);
      auVar4._0_8_ = local_30;
      auVar4._12_4_ = 0x45300000;
      *(double *)error_local =
           (auVar4._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)local_30) - 4503599627370496.0);
      io::Tokenizer::Next(this->input_);
      this_local._7_1_ = true;
    }
    else {
      bVar1 = LookingAt(this,"inf");
      if (bVar1) {
        dVar3 = std::numeric_limits<double>::infinity();
        *(double *)error_local = dVar3;
        io::Tokenizer::Next(this->input_);
        this_local._7_1_ = true;
      }
      else {
        bVar1 = LookingAt(this,"nan");
        __s = value;
        if (bVar1) {
          dVar3 = std::numeric_limits<double>::quiet_NaN();
          *(double *)error_local = dVar3;
          io::Tokenizer::Next(this->input_);
          this_local._7_1_ = true;
        }
        else {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_88,(char *)__s,&local_89);
          AddError(this,&local_88);
          std::__cxx11::string::~string((string *)&local_88);
          std::allocator<char>::~allocator(&local_89);
          this_local._7_1_ = false;
        }
      }
    }
  }
  return this_local._7_1_;
}

Assistant:

bool Parser::ConsumeNumber(double* output, const char* error) {
  if (LookingAtType(io::Tokenizer::TYPE_FLOAT)) {
    *output = io::Tokenizer::ParseFloat(input_->current().text);
    input_->Next();
    return true;
  } else if (LookingAtType(io::Tokenizer::TYPE_INTEGER)) {
    // Also accept integers.
    uint64 value = 0;
    if (!io::Tokenizer::ParseInteger(input_->current().text,
                                     kuint64max, &value)) {
      AddError("Integer out of range.");
      // We still return true because we did, in fact, parse a number.
    }
    *output = value;
    input_->Next();
    return true;
  } else if (LookingAt("inf")) {
    *output = numeric_limits<double>::infinity();
    input_->Next();
    return true;
  } else if (LookingAt("nan")) {
    *output = numeric_limits<double>::quiet_NaN();
    input_->Next();
    return true;
  } else {
    AddError(error);
    return false;
  }
}